

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS
ref_shard_add_pri_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  int iVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  REF_DBL vol_1;
  long local_2e8;
  undefined8 local_2e0;
  REF_INT pri_nodes [27];
  REF_INT tet_nodes [27];
  REF_GLOB pri_global [27];
  REF_GLOB global [27];
  
  lVar11 = -1;
  for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
    iVar1 = nodes[lVar10];
    lVar13 = lVar11;
    if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
       (lVar13 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
      lVar13 = lVar11;
    }
    global[lVar10] = lVar13;
  }
  if (global[1] <= global[0]) {
    global[0] = global[1];
  }
  lVar11 = global[3];
  if (global[2] < global[3]) {
    lVar11 = global[2];
  }
  if (global[0] < lVar11) {
    lVar11 = global[0];
  }
  local_2e8 = global[5];
  if (global[4] < global[5]) {
    local_2e8 = global[4];
  }
  if (lVar11 <= local_2e8) {
    local_2e8 = lVar11;
  }
  RVar2 = *nodes;
  RVar3 = nodes[1];
  RVar4 = nodes[2];
  RVar5 = nodes[3];
  RVar6 = nodes[4];
  RVar7 = nodes[5];
  pri_nodes[1] = RVar3;
  pri_nodes[5] = RVar7;
  pri_nodes[4] = RVar6;
  pri_nodes[0] = RVar2;
  pri_nodes[3] = RVar5;
  pri_nodes[2] = RVar4;
  if (global[1] == local_2e8) {
    pri_nodes[1] = RVar4;
    pri_nodes[5] = RVar5;
    pri_nodes[4] = RVar7;
    pri_nodes[0] = RVar3;
    pri_nodes[3] = RVar6;
    pri_nodes[2] = RVar2;
  }
  if (global[2] == local_2e8) {
    pri_nodes[0] = RVar4;
    pri_nodes[1] = RVar2;
    pri_nodes[2] = RVar3;
    pri_nodes[3] = RVar7;
    pri_nodes[4] = RVar5;
    pri_nodes[5] = RVar6;
  }
  if (global[3] == local_2e8) {
    pri_nodes[0] = RVar5;
    pri_nodes[1] = RVar7;
    pri_nodes[2] = RVar6;
    pri_nodes[3] = RVar2;
    pri_nodes[4] = RVar4;
    pri_nodes[5] = RVar3;
  }
  if (global[4] == local_2e8) {
    pri_nodes[0] = RVar6;
    pri_nodes[1] = RVar5;
    pri_nodes[2] = RVar7;
    pri_nodes[3] = RVar3;
    pri_nodes[4] = RVar2;
    pri_nodes[5] = RVar4;
  }
  if (global[5] == local_2e8) {
    pri_nodes[0] = RVar7;
    pri_nodes[1] = RVar6;
    pri_nodes[2] = RVar5;
    pri_nodes[3] = RVar4;
    pri_nodes[4] = RVar3;
    pri_nodes[5] = RVar2;
  }
  RVar5 = pri_nodes[5];
  RVar4 = pri_nodes[4];
  RVar3 = pri_nodes[2];
  RVar2 = pri_nodes[1];
  local_2e0 = CONCAT44((int)((ulong)global[5] >> 0x20),pri_nodes[0]);
  uVar15 = (ulong)(uint)pri_nodes[3];
  tet_nodes[0] = pri_nodes[0];
  tet_nodes[1] = pri_nodes[4];
  tet_nodes[2] = pri_nodes[5];
  tet_nodes[3] = pri_nodes[3];
  uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,tet_nodes);
  uVar8 = local_2e0;
  if (uVar9 == 0) {
    RVar6 = (REF_INT)local_2e0;
    if (check_volume != 0) {
      uVar9 = ref_node_tet_vol(ref_node,tet_nodes,(REF_DBL *)pri_global);
      if (uVar9 != 0) {
        pcVar14 = "tet vol";
        uVar12 = 0x226;
        goto LAB_0014153d;
      }
      if ((double)pri_global[0] <= 0.0) {
        printf("tet vol %e\n");
        printf("minnode %ld\n",local_2e8);
        printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
        printf("prism %d %d %d %d %d %d\n",uVar8 & 0xffffffff,RVar2,(ulong)(uint)RVar3,uVar15,RVar4,
               RVar5);
        printf("tet %d %d %d %d\n",(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
               (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
      }
    }
    lVar11 = -1;
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      iVar1 = pri_nodes[lVar10];
      lVar13 = lVar11;
      if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
         (lVar13 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
        lVar13 = lVar11;
      }
      pri_global[lVar10] = lVar13;
    }
    if ((pri_global[1] < pri_global[2] && pri_global[1] < pri_global[4]) ||
       (pri_global[5] < pri_global[4] && pri_global[5] < pri_global[2])) {
      tet_nodes[0] = RVar6;
      tet_nodes[1] = RVar2;
      tet_nodes[2] = RVar5;
      tet_nodes[3] = RVar4;
      uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,tet_nodes);
      if (uVar9 == 0) {
        if (check_volume != 0) {
          uVar9 = ref_node_tet_vol(ref_node,tet_nodes,&vol_1);
          if (uVar9 != 0) {
            pcVar14 = "tet vol";
            uVar12 = 0x232;
            goto LAB_0014153d;
          }
          if (vol_1 <= 0.0) {
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar8 & 0xffffffff,RVar2,(ulong)(uint)RVar3,uVar15,
                   RVar4,RVar5);
            printf("tet %d %d %d %d\n",(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
                   (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
          }
        }
        tet_nodes[0] = RVar6;
        tet_nodes[2] = RVar3;
        tet_nodes[1] = RVar2;
        tet_nodes[3] = RVar5;
        uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,tet_nodes);
        if (uVar9 == 0) {
          if (check_volume == 0) {
            return 0;
          }
          uVar9 = ref_node_tet_vol(ref_node,tet_nodes,&vol_1);
          if (uVar9 == 0) goto LAB_00141ae6;
          uVar12 = 0x239;
          goto LAB_00141ad4;
        }
        pcVar14 = "a tet";
        uVar12 = 0x238;
      }
      else {
        pcVar14 = "a tet";
        uVar12 = 0x231;
      }
    }
    else {
      tet_nodes[0] = RVar3;
      tet_nodes[1] = RVar6;
      tet_nodes[2] = RVar4;
      tet_nodes[3] = RVar5;
      uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,tet_nodes);
      if (uVar9 == 0) {
        if (check_volume != 0) {
          uVar9 = ref_node_tet_vol(ref_node,tet_nodes,&vol_1);
          if (uVar9 != 0) {
            pcVar14 = "tet vol";
            uVar12 = 0x240;
            goto LAB_0014153d;
          }
          if (vol_1 <= 0.0) {
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar8 & 0xffffffff,RVar2,(ulong)(uint)RVar3,uVar15,
                   RVar4,RVar5);
            printf("tet %d %d %d %d\n",(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
                   (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
          }
        }
        tet_nodes[0] = RVar6;
        tet_nodes[2] = RVar3;
        tet_nodes[1] = RVar2;
        tet_nodes[3] = RVar4;
        uVar9 = ref_shard_cell_add_local(ref_node,ref_cell,tet_nodes);
        if (uVar9 == 0) {
          if (check_volume == 0) {
            return 0;
          }
          uVar9 = ref_node_tet_vol(ref_node,tet_nodes,&vol_1);
          if (uVar9 == 0) {
LAB_00141ae6:
            if (0.0 < vol_1) {
              return 0;
            }
            printf("tet vol %e\n");
            printf("minnode %ld\n",local_2e8);
            printf("nodes %d %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
                   (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4],nodes[5]);
            printf("prism %d %d %d %d %d %d\n",uVar8 & 0xffffffff,RVar2,(ulong)(uint)RVar3,uVar15,
                   RVar4,RVar5);
            printf("tet %d %d %d %d\n",(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
                   (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
            return 0;
          }
          uVar12 = 0x247;
LAB_00141ad4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 uVar12,"ref_shard_add_pri_as_tet",(ulong)uVar9,"tet vol");
          return uVar9;
        }
        pcVar14 = "a tet";
        uVar12 = 0x246;
      }
      else {
        pcVar14 = "a tet";
        uVar12 = 0x23f;
      }
    }
  }
  else {
    pcVar14 = "add tet";
    uVar12 = 0x225;
  }
LAB_0014153d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar12,
         "ref_shard_add_pri_as_tet",(ulong)uVar9,pcVar14);
  return uVar9;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pri_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB minnode, global[REF_CELL_MAX_SIZE_PER];
  REF_GLOB pri_global[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];

  for (node = 0; node < 6; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  minnode = MIN(MIN(global[0], global[1]), MIN(global[2], global[3]));
  minnode = MIN(MIN(global[4], global[5]), minnode);

  pri_nodes[0] = nodes[0];
  pri_nodes[1] = nodes[1];
  pri_nodes[2] = nodes[2];
  pri_nodes[3] = nodes[3];
  pri_nodes[4] = nodes[4];
  pri_nodes[5] = nodes[5];

  if (global[1] == minnode) {
    pri_nodes[0] = nodes[1];
    pri_nodes[1] = nodes[2];
    pri_nodes[2] = nodes[0];
    pri_nodes[3] = nodes[4];
    pri_nodes[4] = nodes[5];
    pri_nodes[5] = nodes[3];
  }

  if (global[2] == minnode) {
    pri_nodes[0] = nodes[2];
    pri_nodes[1] = nodes[0];
    pri_nodes[2] = nodes[1];
    pri_nodes[3] = nodes[5];
    pri_nodes[4] = nodes[3];
    pri_nodes[5] = nodes[4];
  }

  if (global[3] == minnode) {
    pri_nodes[0] = nodes[3];
    pri_nodes[1] = nodes[5];
    pri_nodes[2] = nodes[4];
    pri_nodes[3] = nodes[0];
    pri_nodes[4] = nodes[2];
    pri_nodes[5] = nodes[1];
  }

  if (global[4] == minnode) {
    pri_nodes[0] = nodes[4];
    pri_nodes[1] = nodes[3];
    pri_nodes[2] = nodes[5];
    pri_nodes[3] = nodes[1];
    pri_nodes[4] = nodes[0];
    pri_nodes[5] = nodes[2];
  }

  if (global[5] == minnode) {
    pri_nodes[0] = nodes[5];
    pri_nodes[1] = nodes[4];
    pri_nodes[2] = nodes[3];
    pri_nodes[3] = nodes[2];
    pri_nodes[4] = nodes[1];
    pri_nodes[5] = nodes[0];
  }

  /* node 0 is now the smallest global index of prism */

  tet_nodes[0] = pri_nodes[0];
  tet_nodes[1] = pri_nodes[4];
  tet_nodes[2] = pri_nodes[5];
  tet_nodes[3] = pri_nodes[3];
  RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "add tet");
  if (check_volume) check_tet_volume();

  for (node = 0; node < 6; node++)
    pri_global[node] = ref_node_global(ref_node, pri_nodes[node]);

  if ((pri_global[1] < pri_global[2] && pri_global[1] < pri_global[4]) ||
      (pri_global[5] < pri_global[2] && pri_global[5] < pri_global[4])) {
    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[5];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  } else {
    tet_nodes[0] = pri_nodes[2];
    tet_nodes[1] = pri_nodes[0];
    tet_nodes[2] = pri_nodes[4];
    tet_nodes[3] = pri_nodes[5];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();

    tet_nodes[0] = pri_nodes[0];
    tet_nodes[1] = pri_nodes[1];
    tet_nodes[2] = pri_nodes[2];
    tet_nodes[3] = pri_nodes[4];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_tet_volume();
  }

  return REF_SUCCESS;
}